

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *
anon_unknown.dwarf_5a0093::getNameLoc(HierarchicalInstanceSyntax *syntax)

{
  long in_RSI;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *in_RDI;
  string_view sVar1;
  SourceLocation loc;
  string_view name;
  SourceLocation *in_stack_ffffffffffffff88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *__str;
  Token *in_stack_ffffffffffffffa0;
  size_t local_48;
  SyntaxNode *in_stack_ffffffffffffffc0;
  size_t local_30;
  SyntaxNode *local_28;
  SourceLocation local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  long local_8;
  
  __str = in_RDI;
  local_8 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_18);
  slang::SourceLocation::SourceLocation(&local_20);
  if (*(long *)(local_8 + 0x18) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa0,
               (char *)__str);
    local_18._M_len = local_48;
    local_18._M_str = (char *)in_stack_ffffffffffffffc0;
    slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffffc0);
    local_20 = slang::parsing::Token::location((Token *)&stack0xffffffffffffffa0);
  }
  else {
    sVar1 = slang::parsing::Token::valueText(in_stack_ffffffffffffffa0);
    local_30 = sVar1._M_len;
    local_18._M_len = local_30;
    local_28 = (SyntaxNode *)sVar1._M_str;
    local_18._M_str = (char *)local_28;
    local_20 = slang::parsing::Token::location((Token *)(*(long *)(local_8 + 0x18) + 0x18));
  }
  std::make_pair<std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
            (&in_RDI->first,in_stack_ffffffffffffff88);
  return __str;
}

Assistant:

std::pair<std::string_view, SourceLocation> getNameLoc(const HierarchicalInstanceSyntax& syntax) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.decl) {
        name = syntax.decl->name.valueText();
        loc = syntax.decl->name.location();
    }
    else {
        name = "";
        loc = syntax.getFirstToken().location();
    }
    return std::make_pair(name, loc);
}